

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pkcs5.c
# Opt level: O3

int mbedtls_pkcs5_pbkdf2_hmac
              (mbedtls_md_context_t *ctx,uchar *password,size_t plen,uchar *salt,size_t slen,
              uint iteration_count,uint32_t key_length,uchar *output)

{
  uchar *puVar1;
  byte bVar2;
  int iVar3;
  ulong uVar4;
  ulong uVar5;
  ulong __n;
  uint uVar6;
  uchar work [64];
  uchar md1 [64];
  uint32_t local_d4;
  uchar local_d0 [4];
  uint local_cc;
  uchar *local_c8;
  size_t local_c0;
  byte local_b8 [64];
  byte local_78 [72];
  
  local_cc = iteration_count;
  bVar2 = mbedtls_md_get_size(ctx->md_info);
  local_d0[0] = '\0';
  local_d0[1] = '\0';
  local_d0[2] = '\0';
  local_d0[3] = '\x01';
  iVar3 = mbedtls_md_hmac_starts(ctx,password,plen);
  if (iVar3 == 0) {
    local_d4 = key_length;
    if (key_length == 0) {
      iVar3 = 0;
    }
    else {
      __n = (ulong)bVar2;
      local_c8 = salt;
      local_c0 = slen;
      do {
        iVar3 = mbedtls_md_hmac_update(ctx,local_c8,local_c0);
        if (iVar3 != 0) {
          return iVar3;
        }
        iVar3 = mbedtls_md_hmac_update(ctx,local_d0,4);
        if (iVar3 != 0) {
          return iVar3;
        }
        iVar3 = mbedtls_md_hmac_finish(ctx,local_b8);
        if (iVar3 != 0) {
          return iVar3;
        }
        iVar3 = mbedtls_md_hmac_reset(ctx);
        if (iVar3 != 0) {
          return iVar3;
        }
        memcpy(local_78,local_b8,__n);
        if (1 < local_cc) {
          uVar6 = 1;
          do {
            iVar3 = mbedtls_md_hmac_update(ctx,local_78,__n);
            if (iVar3 != 0) {
              return iVar3;
            }
            iVar3 = mbedtls_md_hmac_finish(ctx,local_78);
            if (iVar3 != 0) {
              return iVar3;
            }
            iVar3 = mbedtls_md_hmac_reset(ctx);
            if (iVar3 != 0) {
              return iVar3;
            }
            if (bVar2 != 0) {
              uVar4 = 0;
              do {
                local_b8[uVar4] = local_b8[uVar4] ^ local_78[uVar4];
                uVar4 = uVar4 + 1;
              } while (__n != uVar4);
            }
            uVar6 = uVar6 + 1;
          } while (uVar6 != local_cc);
        }
        uVar6 = (uint)bVar2;
        if (local_d4 < bVar2) {
          uVar6 = local_d4;
        }
        memcpy(output,local_b8,(ulong)uVar6);
        local_d4 = local_d4 - uVar6;
        output = output + uVar6;
        uVar4 = 3;
        do {
          if (uVar4 == 0xffffffffffffffff) break;
          uVar5 = uVar4 & 0xffffffff;
          uVar4 = uVar4 - 1;
          puVar1 = local_d0 + uVar5;
          *puVar1 = *puVar1 + '\x01';
        } while (*puVar1 == '\0');
        iVar3 = 0;
      } while (local_d4 != 0);
    }
  }
  return iVar3;
}

Assistant:

int mbedtls_pkcs5_pbkdf2_hmac( mbedtls_md_context_t *ctx,
                       const unsigned char *password,
                       size_t plen, const unsigned char *salt, size_t slen,
                       unsigned int iteration_count,
                       uint32_t key_length, unsigned char *output )
{
    int ret, j;
    unsigned int i;
    unsigned char md1[MBEDTLS_MD_MAX_SIZE];
    unsigned char work[MBEDTLS_MD_MAX_SIZE];
    unsigned char md_size = mbedtls_md_get_size( ctx->md_info );
    size_t use_len;
    unsigned char *out_p = output;
    unsigned char counter[4];

    memset( counter, 0, 4 );
    counter[3] = 1;

#if UINT_MAX > 0xFFFFFFFF
    if( iteration_count > 0xFFFFFFFF )
        return( MBEDTLS_ERR_PKCS5_BAD_INPUT_DATA );
#endif

    if( ( ret = mbedtls_md_hmac_starts( ctx, password, plen ) ) != 0 )
        return( ret );
    while( key_length )
    {
        // U1 ends up in work
        //
        if( ( ret = mbedtls_md_hmac_update( ctx, salt, slen ) ) != 0 )
            return( ret );

        if( ( ret = mbedtls_md_hmac_update( ctx, counter, 4 ) ) != 0 )
            return( ret );

        if( ( ret = mbedtls_md_hmac_finish( ctx, work ) ) != 0 )
            return( ret );

        if( ( ret = mbedtls_md_hmac_reset( ctx ) ) != 0 )
           return( ret );

        memcpy( md1, work, md_size );

        for( i = 1; i < iteration_count; i++ )
        {
            // U2 ends up in md1
            //
            if( ( ret = mbedtls_md_hmac_update( ctx, md1, md_size ) ) != 0 )
                return( ret );

            if( ( ret = mbedtls_md_hmac_finish( ctx, md1 ) ) != 0 )
                return( ret );

            if( ( ret = mbedtls_md_hmac_reset( ctx ) ) != 0 )
                return( ret );

            // U1 xor U2
            //
            for( j = 0; j < md_size; j++ )
                work[j] ^= md1[j];
        }

        use_len = ( key_length < md_size ) ? key_length : md_size;
        memcpy( out_p, work, use_len );

        key_length -= (uint32_t) use_len;
        out_p += use_len;

        for( i = 4; i > 0; i-- )
            if( ++counter[i - 1] != 0 )
                break;
    }

    return( 0 );
}